

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::~EnumLiteGenerator(EnumLiteGenerator *this)

{
  EnumLiteGenerator *this_local;
  
  std::
  vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ::~vector(&this->aliases_);
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~vector(&this->canonical_values_);
  return;
}

Assistant:

EnumLiteGenerator::~EnumLiteGenerator() {}